

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O0

void do_copy(FILE *in,FILE *out)

{
  ostream *this;
  size_t __n;
  size_t len;
  char buf [10240];
  FILE *out_local;
  FILE *in_local;
  
  buf._10232_8_ = out;
  if ((in != (FILE *)0x0) && (out != (FILE *)0x0)) {
    while (__n = fread(&len,1,0x2800,(FILE *)in), __n != 0) {
      fwrite(&len,1,__n,(FILE *)buf._10232_8_);
    }
    fclose((FILE *)in);
    fclose((FILE *)buf._10232_8_);
    return;
  }
  this = std::operator<<((ostream *)&std::cerr,"errors opening files");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

static void
do_copy(FILE* in, FILE* out)
{
    if ((in == nullptr) || (out == nullptr)) {
        std::cerr << "errors opening files" << std::endl;
        exit(2);
    }
    char buf[10240];
    size_t len = 0;
    while ((len = fread(buf, 1, sizeof(buf), in)) > 0) {
        fwrite(buf, 1, len, out);
    }
    if (len != 0) {
        std::cerr << "errors reading or writing" << std::endl;
        exit(2);
    }
    fclose(in);
    fclose(out);
}